

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O0

int sul_compare(lws_dll2_t *d,lws_dll2_t *i)

{
  lws_usec_t b;
  lws_usec_t a;
  lws_dll2_t *i_local;
  lws_dll2_t *d_local;
  
  if ((long)i[1].prev < (long)d[1].prev) {
    d_local._4_4_ = 1;
  }
  else if ((long)d[1].prev < (long)i[1].prev) {
    d_local._4_4_ = -1;
  }
  else {
    d_local._4_4_ = 0;
  }
  return d_local._4_4_;
}

Assistant:

static int
sul_compare(const lws_dll2_t *d, const lws_dll2_t *i)
{
	lws_usec_t a = ((lws_sorted_usec_list_t *)d)->us;
	lws_usec_t b = ((lws_sorted_usec_list_t *)i)->us;

	/*
	 * Simply returning (a - b) in an int
	 * may lead to an integer overflow bug
	 */

	if (a > b)
		return 1;
	if (a < b)
		return -1;

	return 0;
}